

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j1939acd.c
# Opt level: O2

int repeat_address(int sock,uint64_t name)

{
  int iVar1;
  ssize_t sVar2;
  uint8_t dat [8];
  
  dat = (uint8_t  [8])name;
  if (s.verbose != 0) {
    fprintf(_stderr,"- send(, %ld, 8, 0);\n",name);
  }
  sVar2 = sendto(sock,dat,8,0,(sockaddr *)&repeat_address::saddr,0x18);
  iVar1 = must_warn((int)sVar2);
  if (iVar1 != 0) {
    fprintf(_stderr,"send address claim for 0x%02x\n",(ulong)s.last_sa);
  }
  return (int)sVar2;
}

Assistant:

static int repeat_address(int sock, uint64_t name)
{
	int ret;
	uint8_t dat[8];
	static const struct sockaddr_can saddr = {
		.can_family = AF_CAN,
		.can_addr.j1939 = {
			.pgn = J1939_PGN_ADDRESS_CLAIMED,
			.addr = J1939_NO_ADDR,
		},
	};

	memcpy(dat, &name, 8);
	if (!host_is_little_endian())
		bswap(dat, 8);
	if (s.verbose)
		fprintf(stderr, "- send(, %" PRId64 ", 8, 0);\n", name);
	ret = sendto(sock, dat, sizeof(dat), 0, (const struct sockaddr *)&saddr,
		     sizeof(saddr));
	if (must_warn(ret))
		fprintf(stderr, "send address claim for 0x%02x\n", s.last_sa);
	return ret;
}